

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_pad_reflect_1d(ggml_context *ctx,ggml_tensor *a,int p0,int p1)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  int in_ECX;
  int in_EDX;
  ggml_tensor *in_RSI;
  int64_t in_RDI;
  int32_t params [2];
  ggml_tensor *result;
  
  if (in_EDX < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10c2,"GGML_ASSERT(%s) failed","p0 >= 0");
  }
  if (in_ECX < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10c3,"GGML_ASSERT(%s) failed","p1 >= 0");
  }
  if (in_RSI->ne[0] <= (long)in_EDX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10c5,"GGML_ASSERT(%s) failed","p0 < a->ne[0]");
  }
  if (in_RSI->ne[0] <= (long)in_ECX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10c6,"GGML_ASSERT(%s) failed","p1 < a->ne[0]");
  }
  _Var1 = ggml_is_contiguous((ggml_tensor *)0x1517d2);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10c8,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  if (in_RSI->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10c9,"GGML_ASSERT(%s) failed","a->type == GGML_TYPE_F32");
  }
  tensor = ggml_new_tensor_4d(ctx,a._4_4_,CONCAT44(p0,p1),(int64_t)result,(int64_t)params,in_RDI);
  ggml_set_op_params(tensor,(void *)CONCAT44(in_ECX,in_EDX),0x15188d);
  tensor->op = GGML_OP_PAD_REFLECT_1D;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_pad_reflect_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   p0,
        int                   p1) {
    GGML_ASSERT(p0 >= 0);
    GGML_ASSERT(p1 >= 0);

    GGML_ASSERT(p0 < a->ne[0]); // padding length on each size must be less than the
    GGML_ASSERT(p1 < a->ne[0]); // existing length of the dimension being padded

    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(a->type == GGML_TYPE_F32);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type,
            a->ne[0] + p0 + p1,
            a->ne[1],
            a->ne[2],
            a->ne[3]);

    int32_t params[] = { p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_PAD_REFLECT_1D;
    result->src[0] = a;

    return result;
}